

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

CNetAddr * ResolveIP(CNetAddr *__return_storage_ptr__,string *ip)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  readonly_property<bool> in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff11;
  shared_count sStack_e0;
  undefined1 local_d8 [32];
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_b8;
  string local_98;
  undefined1 local_78 [24];
  string *local_60;
  optional<CNetAddr> addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(&local_b8,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffefc;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffef8;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff00;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff08;
  dns_lookup_function._M_invoker._0_1_ = in_stack_ffffffffffffff10.super_class_property<bool>.value;
  dns_lookup_function._M_invoker._1_7_ = in_stack_ffffffffffffff11;
  LookupHost(&addr,ip,false,dns_lookup_function);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  local_d8._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_d8._24_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  local_d8._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x26;
  file.m_begin = local_d8 + 0x10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)args,msg);
  sStack_e0.pi_ = (sp_counted_base *)0x0;
  tinyformat::format<std::__cxx11::string>
            (&local_98,(tinyformat *)"failed to resolve: %s",(char *)ip,args);
  local_78[8] = false;
  local_78._0_8_ = &PTR__lazy_ostream_01139e30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xffffffffffffff10,(lazy_ostream *)local_78,1,1,WARN,0xb4ec59
             ,(size_t)&stack0xffffffffffffff00,0x26);
  std::__cxx11::string::~string((string *)&local_98);
  boost::detail::shared_count::~shared_count(&sStack_e0);
  CNetAddr::CNetAddr((CNetAddr *)local_78);
  std::optional<CNetAddr>::value_or<CNetAddr>(__return_storage_ptr__,&addr,(CNetAddr *)local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_78);
  std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CNetAddr ResolveIP(const std::string& ip)
{
    const std::optional<CNetAddr> addr{LookupHost(ip, false)};
    BOOST_CHECK_MESSAGE(addr.has_value(), strprintf("failed to resolve: %s", ip));
    return addr.value_or(CNetAddr{});
}